

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  cmMakefile *this_00;
  pointer ppcVar1;
  cmGeneratorTarget *this_01;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  string *remote_path;
  ostream *poVar5;
  cmNinjaTargetGenerator *pcVar6;
  pointer ppcVar7;
  string showIncludesPrefix;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&local_48,(cmLocalGenerator *)this,psVar4,remote_path);
  std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = std::operator==(&this->HomeRelativeOutputPath,".");
  if (bVar2) {
    (this->HomeRelativeOutputPath)._M_string_length = 0;
    *(this->HomeRelativeOutputPath)._M_dataplus._M_p = '\0';
  }
  WriteProcessedMakefile
            (this,(ostream *)
                  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                  _vptr_cmGlobalGenerator);
  bVar2 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar2) {
    WriteBuildFileTop(this);
    WritePools(this,(ostream *)
                    (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                    TryCompileTimeout.__r);
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_69);
    psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_68);
    std::__cxx11::string::string((string *)&local_48,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_48._M_string_length != 0) {
      poVar5 = (ostream *)
               (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
               TryCompileTimeout.__r;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"localized /showIncludes string",&local_69);
      cmGlobalNinjaGenerator::WriteComment(poVar5,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      poVar5 = std::operator<<((ostream *)
                               (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                               GlobalGenerator[1].TryCompileTimeout.__r,"msvc_deps_prefix = ");
      poVar5 = std::operator<<(poVar5,(string *)&local_48);
      std::operator<<(poVar5,"\n\n");
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  ppcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar7 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar1; ppcVar7 = ppcVar7 + 1
      ) {
    this_01 = *ppcVar7;
    TVar3 = cmGeneratorTarget::GetType(this_01);
    if (TVar3 != INTERFACE_LIBRARY) {
      pcVar6 = cmNinjaTargetGenerator::New(this_01);
      if (pcVar6 != (cmNinjaTargetGenerator *)0x0) {
        (*(pcVar6->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])(pcVar6);
        bVar2 = cmGlobalGenerator::IsExcluded
                          ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                           GlobalGenerator,this_01);
        if (!bVar2) {
          cmGlobalNinjaGenerator::AddDependencyToAll
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                     this_01);
        }
        (*(pcVar6->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])(pcVar6);
      }
    }
  }
  WriteCustomCommandBuildStatements(this);
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->MaybeConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }

  this->WriteProcessedMakefile(this->GetBuildFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream()
        << "msvc_deps_prefix = " << showIncludesPrefix << "\n\n";
    }
  }

  const std::vector<cmGeneratorTarget*>& targets = this->GetGeneratorTargets();
  for (cmGeneratorTarget* target : targets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmNinjaTargetGenerator* tg = cmNinjaTargetGenerator::New(target);
    if (tg) {
      tg->Generate();
      // Add the target to "all" if required.
      if (!this->GetGlobalNinjaGenerator()->IsExcluded(target)) {
        this->GetGlobalNinjaGenerator()->AddDependencyToAll(target);
      }
      delete tg;
    }
  }

  this->WriteCustomCommandBuildStatements();
}